

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tv_ctrlpt.c
# Opt level: O3

int TvCtrlPointPrintDevice(int devnum)

{
  tv_service *ptVar1;
  bool bVar2;
  bool bVar3;
  TvDeviceNode *pTVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  char spacer [15];
  
  if (devnum < 1) {
    SampleUtil_Print("Error in TvCtrlPointPrintDevice: invalid devnum = %d\n",(ulong)(uint)devnum);
    return -1;
  }
  pthread_mutex_lock((pthread_mutex_t *)&DeviceListMutex);
  uVar8 = 0;
  SampleUtil_Print("TvCtrlPointPrintDevice:\n");
  if (GlobalDeviceList != (TvDeviceNode *)0x0) {
    iVar7 = 0;
    pTVar4 = GlobalDeviceList;
    do {
      if (devnum + iVar7 == 1) {
        SampleUtil_Print("  TvDevice -- %d\n    |                  \n    +- UDN        = %s\n    +- DescDocURL     = %s\n    +- FriendlyName   = %s\n    +- PresURL        = %s\n    +- Adver. TimeOut = %d\n"
                         ,(ulong)(uint)devnum,pTVar4,(pTVar4->device).DescDocURL,
                         (pTVar4->device).FriendlyName,(pTVar4->device).PresURL,
                         (ulong)(uint)(pTVar4->device).AdvrTimeOut);
        lVar6 = 0;
        bVar3 = true;
        do {
          bVar2 = bVar3;
          if (bVar2) {
            spacer[0] = ' ';
            spacer[1] = ' ';
            spacer[2] = ' ';
            spacer[3] = ' ';
            spacer[4] = '|';
            spacer[5] = ' ';
            spacer[6] = ' ';
            spacer[7] = ' ';
          }
          else {
            spacer[0] = ' ';
            spacer[1] = ' ';
            spacer[2] = ' ';
            spacer[3] = ' ';
            spacer[4] = ' ';
            spacer[5] = ' ';
            spacer[6] = ' ';
            spacer[7] = ' ';
          }
          spacer[8] = ' ';
          spacer[9] = '\0';
          ptVar1 = (pTVar4->device).TvService + lVar6;
          SampleUtil_Print("    |                  \n    +- Tv %s Service\n%s+- ServiceId       = %s\n%s+- ServiceType     = %s\n%s+- EventURL        = %s\n%s+- ControlURL      = %s\n%s+- SID             = %s\n%s+- ServiceStateTable\n"
                           ,TvServiceName[lVar6],spacer,ptVar1,spacer,
                           (pTVar4->device).TvService[lVar6].ServiceType,spacer,
                           (pTVar4->device).TvService[lVar6].EventURL,spacer,
                           (pTVar4->device).TvService[lVar6].ControlURL,spacer,
                           (pTVar4->device).TvService[lVar6].SID,spacer);
          if ('\0' < TvVarCount[lVar6]) {
            lVar5 = 0;
            do {
              SampleUtil_Print("%s     +- %-10s = %s\n",spacer,TvVarName[lVar6][lVar5],
                               ptVar1->VariableStrVal[lVar5]);
              lVar5 = lVar5 + 1;
            } while (lVar5 < TvVarCount[lVar6]);
          }
          lVar6 = 1;
          bVar3 = false;
        } while (bVar2);
        goto LAB_00104e1f;
      }
      pTVar4 = pTVar4->next;
      iVar7 = iVar7 + -1;
    } while (pTVar4 != (TvDeviceNode *)0x0);
    uVar8 = -iVar7;
  }
  SampleUtil_Print("Error in TvCtrlPointPrintDevice: invalid devnum = %d  --  actual device count = %d\n"
                   ,(ulong)(uint)devnum,(ulong)uVar8);
LAB_00104e1f:
  SampleUtil_Print("\n");
  pthread_mutex_unlock((pthread_mutex_t *)&DeviceListMutex);
  return 0;
}

Assistant:

int TvCtrlPointPrintDevice(int devnum)
{
	struct TvDeviceNode *tmpdevnode;
	int i = 0, service, var;
	char spacer[15];

	if (devnum <= 0) {
		SampleUtil_Print("Error in TvCtrlPointPrintDevice: "
				 "invalid devnum = %d\n",
			devnum);
		return TV_ERROR;
	}

	ithread_mutex_lock(&DeviceListMutex);

	SampleUtil_Print("TvCtrlPointPrintDevice:\n");
	tmpdevnode = GlobalDeviceList;
	while (tmpdevnode) {
		i++;
		if (i == devnum)
			break;
		tmpdevnode = tmpdevnode->next;
	}
	if (!tmpdevnode) {
		SampleUtil_Print(
			"Error in TvCtrlPointPrintDevice: "
			"invalid devnum = %d  --  actual device count = %d\n",
			devnum,
			i);
	} else {
		SampleUtil_Print("  TvDevice -- %d\n"
				 "    |                  \n"
				 "    +- UDN        = %s\n"
				 "    +- DescDocURL     = %s\n"
				 "    +- FriendlyName   = %s\n"
				 "    +- PresURL        = %s\n"
				 "    +- Adver. TimeOut = %d\n",
			devnum,
			tmpdevnode->device.UDN,
			tmpdevnode->device.DescDocURL,
			tmpdevnode->device.FriendlyName,
			tmpdevnode->device.PresURL,
			tmpdevnode->device.AdvrTimeOut);
		for (service = 0; service < TV_SERVICE_SERVCOUNT; service++) {
			if (service < TV_SERVICE_SERVCOUNT - 1)
				sprintf(spacer, "    |    ");
			else
				sprintf(spacer, "         ");
			SampleUtil_Print("    |                  \n"
					 "    +- Tv %s Service\n"
					 "%s+- ServiceId       = %s\n"
					 "%s+- ServiceType     = %s\n"
					 "%s+- EventURL        = %s\n"
					 "%s+- ControlURL      = %s\n"
					 "%s+- SID             = %s\n"
					 "%s+- ServiceStateTable\n",
				TvServiceName[service],
				spacer,
				tmpdevnode->device.TvService[service].ServiceId,
				spacer,
				tmpdevnode->device.TvService[service]
					.ServiceType,
				spacer,
				tmpdevnode->device.TvService[service].EventURL,
				spacer,
				tmpdevnode->device.TvService[service]
					.ControlURL,
				spacer,
				tmpdevnode->device.TvService[service].SID,
				spacer);
			for (var = 0; var < TvVarCount[service]; var++) {
				SampleUtil_Print("%s     +- %-10s = %s\n",
					spacer,
					TvVarName[service][var],
					tmpdevnode->device.TvService[service]
						.VariableStrVal[var]);
			}
		}
	}
	SampleUtil_Print("\n");
	ithread_mutex_unlock(&DeviceListMutex);

	return TV_SUCCESS;
}